

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  BYTE *src;
  void *src_00;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  void *pvVar8;
  ZSTD_nextInputType_e ZVar9;
  ZSTD_DDict *pZVar10;
  char *pcVar11;
  size_t sVar12;
  ulong uVar13;
  bool bVar14;
  ulong uVar15;
  ZSTD_dStage ZVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  void *pvVar20;
  void *src_01;
  size_t sVar21;
  ZSTD_frameSizeInfo ZVar22;
  void *local_b8;
  
  uVar3 = input->pos;
  uVar4 = input->size;
  sVar21 = 0xffffffffffffffb8;
  if (uVar3 <= uVar4) {
    uVar5 = output->pos;
    uVar6 = output->size;
    sVar21 = 0xffffffffffffffba;
    if (uVar5 <= uVar6) {
      src_00 = (void *)(uVar3 + (long)input->src);
      pvVar20 = (void *)((long)input->src + uVar4);
      pvVar7 = output->dst;
      src = zds->headerBuffer;
      bVar14 = false;
      pvVar8 = src_00;
      local_b8 = (void *)((long)pvVar7 + uVar5);
LAB_00137c5f:
      do {
        while( true ) {
          src_01 = pvVar8;
          if (bVar14) {
            uVar13 = (long)src_01 - (long)input->src;
            input->pos = uVar13;
            output->pos = (long)local_b8 - (long)output->dst;
            if ((src_01 == src_00) && (local_b8 == (void *)((long)pvVar7 + uVar5))) {
              iVar2 = zds->noForwardProgress;
              zds->noForwardProgress = iVar2 + 1;
              if (0xe < iVar2) {
                if (uVar5 == uVar6) {
                  return 0xffffffffffffffba;
                }
                if (uVar4 == uVar3) {
                  return 0xffffffffffffffb8;
                }
              }
            }
            else {
              zds->noForwardProgress = 0;
            }
            sVar21 = zds->expected;
            if (sVar21 != 0) {
              ZVar9 = ZSTD_nextInputType(zds);
              return (sVar21 - zds->inPos) + (ulong)(ZVar9 == ZSTDnit_block) * 3;
            }
            if (zds->outEnd != zds->outStart) {
              if (zds->hostageByte == 0) {
                input->pos = uVar13 - 1;
                zds->hostageByte = 1;
                return 1;
              }
              return 1;
            }
            if (zds->hostageByte != 0) {
              if (input->size <= uVar13) {
                zds->streamStage = zdss_read;
                return 1;
              }
              input->pos = uVar13 + 1;
            }
            return 0;
          }
          switch(zds->streamStage) {
          case zdss_init:
            zds->streamStage = zdss_loadHeader;
            zds->inPos = 0;
            zds->legacyVersion = 0;
            zds->hostageByte = 0;
            zds->outStart = 0;
            zds->outEnd = 0;
            zds->lhSize = 0;
            sVar21 = 0;
            break;
          case zdss_loadHeader:
            sVar21 = zds->lhSize;
            break;
          case zdss_read:
            goto switchD_00137c8a_caseD_2;
          case zdss_load:
            sVar21 = zds->expected;
            goto LAB_00137f48;
          case zdss_flush:
            sVar21 = zds->outStart;
            sVar12 = zds->outEnd;
            goto LAB_00138071;
          default:
            return 0xffffffffffffffff;
          }
          sVar21 = ZSTD_getFrameHeader_advanced(&zds->fParams,src,sVar21,zds->format);
          if (0xffffffffffffff88 < sVar21) {
            return sVar21;
          }
          if (sVar21 == 0) break;
          sVar12 = zds->lhSize;
          uVar13 = sVar21 - sVar12;
          uVar17 = (long)pvVar20 - (long)src_01;
          if (uVar17 < uVar13) {
            if (pvVar20 != src_01) {
              memcpy(src + sVar12,src_01,uVar17);
              sVar12 = uVar17 + zds->lhSize;
              zds->lhSize = sVar12;
            }
            input->pos = input->size;
            sVar19 = 6;
            if (6 < sVar21) {
              sVar19 = sVar21;
            }
            return (sVar19 - sVar12) + 3;
          }
          memcpy(src + sVar12,src_01,uVar13);
          zds->lhSize = sVar21;
          bVar14 = false;
          pvVar8 = (void *)((long)src_01 + uVar13);
        }
        uVar13 = (zds->fParams).frameContentSize;
        if (((uVar13 != 0) && ((zds->fParams).windowSize != 0)) &&
           (uVar17 = (long)pvVar7 + (uVar6 - (long)local_b8), uVar13 <= uVar17)) {
          ZVar22 = ZSTD_findFrameSizeInfo(src_00,uVar4 - uVar3);
          uVar13 = ZVar22.compressedSize;
          if (uVar13 <= uVar4 - uVar3) {
            pZVar10 = ZSTD_getDDict(zds);
            sVar21 = ZSTD_decompress_usingDDict(zds,local_b8,uVar17,src_00,uVar13,pZVar10);
            if (0xffffffffffffff88 < sVar21) {
              return sVar21;
            }
            local_b8 = (void *)((long)local_b8 + sVar21);
            zds->expected = 0;
            zds->streamStage = zdss_init;
            bVar14 = true;
            pvVar8 = (void *)(uVar13 + (long)src_00);
            goto LAB_00137c5f;
          }
        }
        pZVar10 = ZSTD_getDDict(zds);
        ZSTD_decompressBegin_usingDDict(zds,pZVar10);
        if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
          uVar13 = (ulong)*(uint *)(zds->headerBuffer + 4);
          ZVar16 = ZSTDds_skipFrame;
        }
        else {
          sVar21 = ZSTD_decodeFrameHeader(zds,src,zds->lhSize);
          uVar13 = 3;
          ZVar16 = ZSTDds_decodeBlockHeader;
          if (0xffffffffffffff88 < sVar21) {
            return sVar21;
          }
        }
        zds->expected = uVar13;
        zds->stage = ZVar16;
        uVar13 = (zds->fParams).windowSize;
        if (uVar13 < 0x401) {
          uVar13 = 0x400;
        }
        (zds->fParams).windowSize = uVar13;
        if (zds->maxWindowSize < uVar13) {
          return 0xfffffffffffffff0;
        }
        uVar1 = (zds->fParams).blockSizeMax;
        uVar17 = (ulong)uVar1;
        if (uVar1 < 5) {
          uVar17 = 4;
        }
        uVar18 = (zds->fParams).frameContentSize;
        uVar15 = 0x20000;
        if (uVar13 < 0x20000) {
          uVar15 = uVar13;
        }
        uVar13 = uVar13 + uVar15 + 0x10;
        if (uVar13 < uVar18) {
          uVar18 = uVar13;
        }
        if ((zds->inBuffSize < uVar17) || (zds->outBuffSize < uVar18)) {
          if (zds->staticSize == 0) {
            ZSTD_free(zds->inBuff,zds->customMem);
            zds->inBuffSize = 0;
            zds->outBuffSize = 0;
            pcVar11 = (char *)ZSTD_malloc(uVar17 + uVar18,zds->customMem);
            zds->inBuff = pcVar11;
            if (pcVar11 == (char *)0x0) {
              return 0xffffffffffffffc0;
            }
          }
          else {
            if (zds->staticSize - 0x271f8 < uVar17 + uVar18) {
              return 0xffffffffffffffc0;
            }
            pcVar11 = zds->inBuff;
          }
          zds->inBuffSize = uVar17;
          zds->outBuff = pcVar11 + uVar17;
          zds->outBuffSize = uVar18;
        }
        zds->streamStage = zdss_read;
switchD_00137c8a_caseD_2:
        sVar21 = zds->expected;
        if (sVar21 == 0) {
          zds->streamStage = zdss_init;
          bVar14 = true;
          pvVar8 = src_01;
        }
        else {
          if (sVar21 <= (ulong)((long)pvVar20 - (long)src_01)) goto LAB_00138037;
          bVar14 = true;
          pvVar8 = pvVar20;
          if (src_01 != pvVar20) {
            zds->streamStage = zdss_load;
LAB_00137f48:
            sVar12 = zds->inPos;
            uVar13 = sVar21 - sVar12;
            ZVar16 = zds->stage;
            if (ZVar16 == ZSTDds_skipFrame) {
              uVar17 = (long)pvVar20 - (long)src_01;
              if (uVar13 < (ulong)((long)pvVar20 - (long)src_01)) {
                uVar17 = uVar13;
              }
            }
            else {
              if (zds->inBuffSize - sVar12 < uVar13) {
                return 0xffffffffffffffec;
              }
              uVar17 = (long)pvVar20 - (long)src_01;
              if (uVar13 < (ulong)((long)pvVar20 - (long)src_01)) {
                uVar17 = uVar13;
              }
              memcpy(zds->inBuff + sVar12,src_01,uVar17);
              sVar12 = zds->inPos;
            }
            src_01 = (void *)((long)src_01 + uVar17);
            zds->inPos = sVar12 + uVar17;
            bVar14 = true;
            pvVar8 = src_01;
            if (uVar13 <= uVar17) {
              sVar12 = ZSTD_decompressContinue
                                 (zds,zds->outBuff + zds->outStart,zds->outBuffSize - zds->outStart,
                                  zds->inBuff,sVar21);
              if (0xffffffffffffff88 < sVar12) {
                return sVar12;
              }
              zds->inPos = 0;
              if ((ZVar16 != ZSTDds_skipFrame) && (sVar12 == 0)) {
                zds->streamStage = zdss_read;
                goto LAB_00138169;
              }
              sVar21 = zds->outStart;
              sVar12 = sVar12 + sVar21;
              zds->outEnd = sVar12;
              zds->streamStage = zdss_flush;
LAB_00138071:
              uVar18 = sVar12 - sVar21;
              uVar17 = (long)pvVar7 + (uVar6 - (long)local_b8);
              uVar13 = uVar18;
              if (uVar17 < uVar18) {
                uVar13 = uVar17;
              }
              memcpy(local_b8,zds->outBuff + sVar21,uVar13);
              local_b8 = (void *)((long)local_b8 + uVar13);
              sVar21 = uVar13 + zds->outStart;
              zds->outStart = sVar21;
              bVar14 = true;
              pvVar8 = src_01;
              if (uVar18 <= uVar17) {
                zds->streamStage = zdss_read;
                bVar14 = false;
                if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
                   (bVar14 = false, zds->outBuffSize < sVar21 + (zds->fParams).blockSizeMax)) {
                  zds->outStart = 0;
                  zds->outEnd = 0;
                  bVar14 = false;
                }
              }
            }
          }
        }
      } while( true );
    }
  }
  return sVar21;
LAB_00138037:
  ZVar16 = zds->stage;
  if (ZVar16 == ZSTDds_skipFrame) {
    sVar12 = 0;
  }
  else {
    sVar12 = zds->outBuffSize - zds->outStart;
  }
  sVar12 = ZSTD_decompressContinue(zds,zds->outBuff + zds->outStart,sVar12,src_01,sVar21);
  if (0xffffffffffffff88 < sVar12) {
    return sVar12;
  }
  src_01 = (void *)((long)src_01 + sVar21);
  if ((ZVar16 == ZSTDds_skipFrame) || (bVar14 = false, pvVar8 = src_01, sVar12 != 0)) {
    zds->outEnd = zds->outStart + sVar12;
    zds->streamStage = zdss_flush;
LAB_00138169:
    bVar14 = false;
    pvVar8 = src_01;
  }
  goto LAB_00137c5f;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const istart = (const char*)(input->src) + input->pos;
    const char* const iend = (const char*)(input->src) + input->size;
    const char* ip = istart;
    char* const ostart = (char*)(output->dst) + output->pos;
    char* const oend = (char*)(output->dst) + output->size;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
            zds->legacyVersion = 0;
            zds->hostageByte = 0;
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize));
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX(ZSTD_FRAMEHEADERSIZE_MIN, hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize && zds->fParams.windowSize /* skippable frame if == 0 */
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, iend-istart);
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, oend-op, istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)));

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize));
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge);

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize);
                if ((zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize)) {
                    size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                    DEBUGLOG(4, "inBuff  : from %u to %u",
                                (U32)zds->inBuffSize, (U32)neededInBuffSize);
                    DEBUGLOG(4, "outBuff : from %u to %u",
                                (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                    if (zds->staticSize) {  /* static DCtx */
                        DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                        assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                        RETURN_ERROR_IF(
                            bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                            memory_allocation);
                    } else {
                        ZSTD_free(zds->inBuff, zds->customMem);
                        zds->inBuffSize = 0;
                        zds->outBuffSize = 0;
                        zds->inBuff = (char*)ZSTD_malloc(bufferSize, zds->customMem);
                        RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation);
                    }
                    zds->inBuffSize = neededInBuffSize;
                    zds->outBuff = zds->inBuff + zds->inBuffSize;
                    zds->outBuffSize = neededOutBuffSize;
            }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    int const isSkipFrame = ZSTD_isSkipFrame(zds);
                    size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, (isSkipFrame ? 0 : zds->outBuffSize - zds->outStart),
                        ip, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    ip += neededInSize;
                    if (!decodedSize && !isSkipFrame) break;   /* this was just a header */
                    zds->outEnd = zds->outStart + decodedSize;
                    zds->streamStage = zdss_flush;
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, iend-ip);
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                {   size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, zds->outBuffSize - zds->outStart,
                        zds->inBuff, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    zds->inPos = 0;   /* input is consumed */
                    if (!decodedSize && !isSkipFrame) { zds->streamStage = zdss_read; break; }   /* this was just a header */
                    zds->outEnd = zds->outStart +  decodedSize;
            }   }
            zds->streamStage = zdss_flush;
            /* fall-through */

        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, oend-op, zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC);   /* some compiler require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));
    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, dstSize_tooSmall);
            RETURN_ERROR_IF(ip==iend, srcSize_wrong);
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}